

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

UObject * __thiscall
icu_63::ICUService::getKey
          (ICUService *this,ICUServiceKey *key,UnicodeString *actualReturn,
          ICUServiceFactory *factory,UErrorCode *status)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  ICUServiceFactory *pIVar7;
  Hashtable *this_00;
  UMemory *this_01;
  long *plVar8;
  UnicodeString *pUVar9;
  UnicodeString *pUVar10;
  UObject *pUVar11;
  undefined4 extraout_var_00;
  char cVar12;
  uint index;
  code *pcVar13;
  size_t size;
  void *p;
  int index_00;
  int32_t iVar14;
  UHashtable *pUVar15;
  XMutex mutex;
  UnicodeString currentDescriptor;
  UVector *local_b0;
  UnicodeString local_70;
  undefined4 extraout_var;
  
  if (U_ZERO_ERROR < *status) {
    return (UObject *)0x0;
  }
  pcVar13 = (code *)key;
  iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xc])();
  if ((char)iVar5 != '\0') goto LAB_001ad852;
  if (factory == (ICUServiceFactory *)0x0) {
    umtx_lock_63((UMutex *)lock);
  }
  if (this->serviceCache == (Hashtable *)0x0) {
    this_00 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)pcVar13);
    if (this_00 == (Hashtable *)0x0) {
      this_00 = (Hashtable *)0x0;
    }
    else {
      this_00->hash = (UHashtable *)0x0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar15 = &this_00->hashObj;
        pcVar13 = uhash_hashUnicodeString_63;
        uhash_init_63(pUVar15,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,
                      (undefined1 *)0x0,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          this_00->hash = pUVar15;
          pcVar13 = uprv_deleteUObject_63;
          uhash_setKeyDeleter_63(pUVar15,uprv_deleteUObject_63);
        }
      }
    }
    this->serviceCache = this_00;
    if (this_00 != (Hashtable *)0x0) {
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        uhash_setValueDeleter_63(this_00->hash,cacheDeleter);
        goto LAB_001ad2e9;
      }
      Hashtable::~Hashtable(this_00);
      UMemory::operator_delete((UMemory *)this_00,pcVar13);
    }
    bVar2 = false;
    pUVar11 = (UObject *)0x0;
  }
  else {
LAB_001ad2e9:
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0024a818;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    iVar5 = this->factories->count;
    if (factory == (ICUServiceFactory *)0x0) {
      index_00 = 0;
LAB_001ad3cf:
      if (iVar5 < index_00) {
        iVar5 = index_00;
      }
      local_b0 = (UVector *)0x0;
      bVar2 = false;
      do {
        bVar3 = bVar2;
        uVar1 = local_70.fUnion.fStackFields.fLengthAndFlags & 1;
        local_70.fUnion.fStackFields.fLengthAndFlags =
             local_70.fUnion.fStackFields.fLengthAndFlags & 0x1e;
        if (uVar1 != 0) {
          local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        }
        (*(key->super_UObject)._vptr_UObject[6])(key,&local_70);
        pcVar13 = (code *)&local_70;
        this_01 = (UMemory *)uhash_get_63(this->serviceCache->hash,pcVar13);
        if (this_01 != (UMemory *)0x0) break;
        this_01 = (UMemory *)0x0;
        iVar14 = index_00;
        do {
          if (iVar5 == iVar14) {
            if (local_b0 == (UVector *)0x0) {
              local_b0 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)pcVar13);
              if (local_b0 == (UVector *)0x0) {
                local_b0 = (UVector *)0x0;
              }
              else {
                pcVar13 = uprv_deleteUObject_63;
                UVector::UVector(local_b0,uprv_deleteUObject_63,(UElementsAreEqual *)0x0,5,status);
              }
              cVar12 = '\x01';
              if (U_ZERO_ERROR < *status) break;
            }
            pUVar9 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pcVar13);
            if (pUVar9 == (UnicodeString *)0x0) {
              pUVar9 = (UnicodeString *)0x0;
            }
            else {
              UnicodeString::UnicodeString(pUVar9,&local_70);
            }
            if ((pUVar9 == (UnicodeString *)0x0) ||
               ((undefined1  [56])((undefined1  [56])pUVar9->fUnion & (undefined1  [56])0x1) !=
                (undefined1  [56])0x0)) {
              *status = U_MEMORY_ALLOCATION_ERROR;
              cVar12 = '\x01';
            }
            else {
              UVector::addElement(local_b0,pUVar9,status);
              cVar12 = U_ZERO_ERROR < *status;
            }
            break;
          }
          plVar8 = (long *)UVector::elementAt(this->factories,iVar14);
          pcVar13 = (code *)key;
          plVar8 = (long *)(**(code **)(*plVar8 + 0x18))(plVar8,key,this,status);
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            if (plVar8 == (long *)0x0) {
              cVar12 = '\0';
              bVar2 = true;
            }
            else {
              this_01 = (UMemory *)UMemory::operator_new((UMemory *)0x50,(size_t)pcVar13);
              if (this_01 == (UMemory *)0x0) {
                this_01 = (UMemory *)0x0;
              }
              else {
                *(undefined4 *)this_01 = 1;
                pcVar13 = (code *)&local_70;
                UnicodeString::UnicodeString
                          ((UnicodeString *)(this_01 + 8),(UnicodeString *)pcVar13);
                *(long **)(this_01 + 0x48) = plVar8;
              }
              if (this_01 != (UMemory *)0x0) {
                cVar12 = '\t';
                goto LAB_001ad4d8;
              }
              (**(code **)(*plVar8 + 8))(plVar8);
              *status = U_MEMORY_ALLOCATION_ERROR;
              cVar12 = '\x01';
              bVar2 = false;
              this_01 = (UMemory *)0x0;
            }
          }
          else {
            cVar12 = '\x01';
            if (plVar8 != (long *)0x0) {
              (**(code **)(*plVar8 + 8))(plVar8);
            }
LAB_001ad4d8:
            bVar2 = false;
          }
          iVar14 = iVar14 + 1;
        } while (bVar2);
        if (cVar12 != '\0') {
          bVar3 = true;
          if (cVar12 != '\t') {
            bVar2 = false;
            pUVar11 = (UObject *)0x0;
            goto LAB_001ad818;
          }
          break;
        }
        iVar6 = (*(key->super_UObject)._vptr_UObject[7])();
        bVar3 = true;
        bVar2 = true;
      } while ((char)iVar6 != '\0');
      if (this_01 == (UMemory *)0x0) {
        bVar2 = true;
      }
      else {
        if (!bVar3 || factory != (ICUServiceFactory *)0x0) {
LAB_001ad5fc:
          if (actualReturn != (UnicodeString *)0x0) {
            pUVar9 = (UnicodeString *)(this_01 + 8);
            if (*(short *)(this_01 + 0x10) < 0) {
              iVar14 = *(int32_t *)(this_01 + 0x14);
            }
            else {
              iVar14 = (int)*(short *)(this_01 + 0x10) >> 5;
            }
            iVar14 = UnicodeString::doIndexOf(pUVar9,L'/',0,iVar14);
            pUVar10 = pUVar9;
            if (iVar14 == 0) {
              uVar1 = (actualReturn->fUnion).fStackFields.fLengthAndFlags;
              uVar4 = 2;
              if ((uVar1 & 1) == 0) {
                uVar4 = uVar1 & 0x1e;
              }
              (actualReturn->fUnion).fStackFields.fLengthAndFlags = uVar4;
              if (*(short *)(this_01 + 0x10) < 0) {
                iVar5 = *(int *)(this_01 + 0x14);
              }
              else {
                iVar5 = (int)*(short *)(this_01 + 0x10) >> 5;
              }
              UnicodeString::doAppend(actualReturn,pUVar9,1,iVar5 + -1);
            }
            else {
              UnicodeString::operator=(actualReturn,pUVar9);
            }
            if ((undefined1  [56])((undefined1  [56])actualReturn->fUnion & (undefined1  [56])0x1)
                != (undefined1  [56])0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
              if (*(long **)(this_01 + 0x48) != (long *)0x0) {
                (**(code **)(**(long **)(this_01 + 0x48) + 8))();
              }
              UnicodeString::~UnicodeString(pUVar9);
              UMemory::operator_delete(this_01,pUVar10);
              goto LAB_001ad80d;
            }
          }
          p = *(void **)(this_01 + 0x48);
          iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xe])();
          pUVar11 = (UObject *)CONCAT44(extraout_var,iVar5);
          if (bVar3 && factory != (ICUServiceFactory *)0x0) {
            if (*(long **)(this_01 + 0x48) != (long *)0x0) {
              (**(code **)(**(long **)(this_01 + 0x48) + 8))();
            }
            UnicodeString::~UnicodeString((UnicodeString *)(this_01 + 8));
            UMemory::operator_delete(this_01,p);
          }
          bVar2 = false;
          goto LAB_001ad818;
        }
        Hashtable::put(this->serviceCache,(UnicodeString *)(this_01 + 8),this_01,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          if (local_b0 != (UVector *)0x0) {
            index = local_b0->count;
            while (0 < (int)index) {
              index = index - 1;
              size = (size_t)index;
              pUVar9 = (UnicodeString *)UVector::elementAt(local_b0,index);
              pUVar15 = this->serviceCache->hash;
              pUVar10 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,size);
              if (pUVar10 == (UnicodeString *)0x0) {
                pUVar10 = (UnicodeString *)0x0;
              }
              else {
                UnicodeString::UnicodeString(pUVar10,pUVar9);
              }
              uhash_put_63(pUVar15,pUVar10,this_01,status);
              if (U_ZERO_ERROR < *status) goto LAB_001ad80d;
              *(int *)this_01 = *(int *)this_01 + 1;
              UVector::removeElementAt(local_b0,index);
            }
          }
          goto LAB_001ad5fc;
        }
LAB_001ad80d:
        bVar2 = false;
      }
      pUVar11 = (UObject *)0x0;
    }
    else {
      if (0 < iVar5) {
        index_00 = 0;
        do {
          pIVar7 = (ICUServiceFactory *)UVector::elementAt(this->factories,index_00);
          index_00 = index_00 + 1;
          if (pIVar7 == factory) goto LAB_001ad340;
        } while (iVar5 != index_00);
      }
      index_00 = 0;
LAB_001ad340:
      if (index_00 != 0) goto LAB_001ad3cf;
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      local_b0 = (UVector *)0x0;
      bVar2 = false;
      pUVar11 = (UObject *)0x0;
    }
LAB_001ad818:
    if (local_b0 != (UVector *)0x0) {
      (*(local_b0->super_UObject)._vptr_UObject[1])();
    }
    UnicodeString::~UnicodeString(&local_70);
  }
  if (factory == (ICUServiceFactory *)0x0) {
    umtx_unlock_63((UMutex *)lock);
  }
  if (!bVar2) {
    return pUVar11;
  }
LAB_001ad852:
  iVar5 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x11])(this,key,actualReturn,status);
  return (UObject *)CONCAT44(extraout_var_00,iVar5);
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result, const Locale& locale) const 
{
    {
        UErrorCode status = U_ZERO_ERROR;
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceFactory* f = (ICUServiceFactory*)map->get(id);
            if (f != NULL) {
                f->getDisplayName(id, locale, result);
                return result;
            }

            // fallback
            status = U_ZERO_ERROR;
            ICUServiceKey* fallbackKey = createKey(&id, status);
            while (fallbackKey != NULL && fallbackKey->fallback()) {
                UnicodeString us;
                fallbackKey->currentID(us);
                f = (ICUServiceFactory*)map->get(us);
                if (f != NULL) {
                    f->getDisplayName(id, locale, result);
                    delete fallbackKey;
                    return result;
                }
            }
            delete fallbackKey;
        }
    }
    result.setToBogus();
    return result;
}